

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCex.c
# Opt level: O1

Abc_Cex_t * Gia_ManCexExtendToIncludeAllObjects(Gia_Man_t *p,Abc_Cex_t *pCex)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  Abc_Cex_t *pAVar4;
  int iVar5;
  int iVar6;
  Vec_Int_t *pVVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  Gia_Obj_t *pGVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  
  if (pCex->nRegs < 1) {
    __assert_fail("pCex->nRegs > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCex.c"
                  ,0x162,"Abc_Cex_t *Gia_ManCexExtendToIncludeAllObjects(Gia_Man_t *, Abc_Cex_t *)")
    ;
  }
  uVar10 = 0;
  pAVar4 = Abc_CexAlloc(0,p->nObjs,pCex->iFrame + 1);
  pAVar4->iFrame = pCex->iFrame;
  pAVar4->iPo = pCex->iPo;
  *(ulong *)p->pObjs = *(ulong *)p->pObjs & 0xffffffffbfffffff;
  iVar9 = p->nRegs;
  if (0 < iVar9) {
    uVar14 = 0;
    do {
      iVar8 = p->vCos->nSize;
      uVar12 = (iVar8 - iVar9) + uVar14;
      if (((int)uVar12 < 0) || (iVar8 <= (int)uVar12)) goto LAB_0065c67e;
      iVar9 = p->vCos->pArray[uVar12];
      lVar11 = (long)iVar9;
      if ((lVar11 < 0) || (p->nObjs <= iVar9)) goto LAB_0065c65f;
      pGVar13 = p->pObjs;
      if (pGVar13 == (Gia_Obj_t *)0x0) {
        uVar10 = (ulong)uVar14;
        break;
      }
      uVar12 = uVar14 + 1;
      uVar10 = (ulong)uVar12;
      *(ulong *)(pGVar13 + lVar11) =
           *(ulong *)(pGVar13 + lVar11) & 0xffffffffbfffffff |
           (ulong)(((uint)(&pCex[1].iPo)[uVar14 >> 5] >> ((byte)uVar14 & 0x1f) & 1) << 0x1e);
      iVar9 = p->nRegs;
      uVar14 = uVar12;
    } while ((int)uVar12 < iVar9);
  }
  iVar9 = (int)uVar10;
  if (iVar9 != pCex->nRegs) {
    __assert_fail("iBit == pCex->nRegs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCex.c"
                  ,0x16c,"Abc_Cex_t *Gia_ManCexExtendToIncludeAllObjects(Gia_Man_t *, Abc_Cex_t *)")
    ;
  }
  if (-1 < pCex->iFrame) {
    iVar8 = 0;
    do {
      pVVar7 = p->vCis;
      uVar15 = (ulong)(uint)pVVar7->nSize;
      if (p->nRegs < pVVar7->nSize) {
        lVar11 = 0;
        do {
          if ((int)uVar15 <= lVar11) goto LAB_0065c67e;
          lVar16 = (long)pVVar7->pArray[lVar11];
          if ((lVar16 < 0) || (p->nObjs <= pVVar7->pArray[lVar11])) goto LAB_0065c65f;
          pGVar13 = p->pObjs;
          if (pGVar13 == (Gia_Obj_t *)0x0) break;
          *(ulong *)(pGVar13 + lVar16) =
               *(ulong *)(pGVar13 + lVar16) & 0xffffffffbfffffff |
               (ulong)(((uint)(&pCex[1].iPo)[(int)(uVar10 + lVar11) >> 5] >>
                        ((byte)(uVar10 + lVar11) & 0x1f) & 1) << 0x1e);
          lVar11 = lVar11 + 1;
          pVVar7 = p->vCis;
          uVar15 = (ulong)pVVar7->nSize;
        } while (lVar11 < (long)(uVar15 - (long)p->nRegs));
        uVar10 = (ulong)(uint)((int)uVar10 + (int)lVar11);
      }
      iVar9 = (int)uVar10;
      iVar6 = p->nRegs;
      if (0 < iVar6) {
        iVar5 = 0;
        do {
          iVar1 = p->vCos->nSize;
          uVar14 = (iVar1 - iVar6) + iVar5;
          if (((int)uVar14 < 0) || (iVar1 <= (int)uVar14)) goto LAB_0065c67e;
          iVar1 = p->vCos->pArray[uVar14];
          if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_0065c65f;
          pGVar13 = p->pObjs;
          if (pGVar13 == (Gia_Obj_t *)0x0) break;
          iVar2 = p->vCis->nSize;
          uVar14 = (iVar2 - iVar6) + iVar5;
          if (((int)uVar14 < 0) || (iVar2 <= (int)uVar14)) goto LAB_0065c67e;
          iVar6 = p->vCis->pArray[uVar14];
          lVar11 = (long)iVar6;
          if ((lVar11 < 0) || (p->nObjs <= iVar6)) goto LAB_0065c65f;
          *(ulong *)(pGVar13 + lVar11) =
               *(ulong *)(pGVar13 + lVar11) & 0xffffffffbfffffff |
               (ulong)((uint)*(undefined8 *)(pGVar13 + iVar1) & 0x40000000);
          iVar5 = iVar5 + 1;
          iVar6 = p->nRegs;
        } while (iVar5 < iVar6);
      }
      if ((0 < p->nObjs) && (pGVar13 = p->pObjs, pGVar13 != (Gia_Obj_t *)0x0)) {
        lVar11 = 0;
        do {
          if ((pGVar13->field_0x3 & 0x40) != 0) {
            iVar6 = pAVar4->nPis * iVar8 + (int)lVar11;
            (&pAVar4[1].iPo)[iVar6 >> 5] = (&pAVar4[1].iPo)[iVar6 >> 5] | 1 << ((byte)iVar6 & 0x1f);
          }
          lVar11 = lVar11 + 1;
          pGVar13 = pGVar13 + 1;
        } while (lVar11 < p->nObjs);
      }
      if (0 < p->nObjs) {
        lVar11 = 0;
        lVar16 = 0;
        do {
          pGVar13 = p->pObjs;
          if (pGVar13 == (Gia_Obj_t *)0x0) break;
          uVar15 = *(ulong *)(&pGVar13->field_0x0 + lVar11);
          if ((uVar15 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar15) {
            *(ulong *)(&pGVar13->field_0x0 + lVar11) =
                 uVar15 & 0xffffffff3fffffff |
                 (ulong)((((uint)(uVar15 >> 0x3d) ^
                          *(uint *)((long)pGVar13 +
                                   (ulong)((uint)(uVar15 >> 0x1e) & 0x7ffffffc) * -3 + lVar11) >>
                          0x1e) & ((uint)(uVar15 >> 0x1d) & 7 ^
                                  *(uint *)((long)pGVar13 +
                                           (ulong)(uint)((int)(uVar15 & 0x1fffffff) << 2) * -3 +
                                           lVar11) >> 0x1e) & 1) << 0x1e);
          }
          lVar16 = lVar16 + 1;
          lVar11 = lVar11 + 0xc;
        } while (lVar16 < p->nObjs);
      }
      pVVar7 = p->vCos;
      if (0 < pVVar7->nSize) {
        lVar11 = 0;
        do {
          iVar6 = pVVar7->pArray[lVar11];
          if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) goto LAB_0065c65f;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar13 = p->pObjs + iVar6;
          uVar14 = (uint)*(ulong *)pGVar13;
          *(ulong *)pGVar13 =
               *(ulong *)pGVar13 & 0xffffffffbfffffff |
               (ulong)((uVar14 * 2 ^ *(uint *)(pGVar13 + -(ulong)(uVar14 & 0x1fffffff))) &
                      0x40000000);
          lVar11 = lVar11 + 1;
          pVVar7 = p->vCos;
        } while (lVar11 < pVVar7->nSize);
      }
      bVar3 = iVar8 < pCex->iFrame;
      iVar8 = iVar8 + 1;
    } while (bVar3);
  }
  if (iVar9 != pCex->nBits) {
    __assert_fail("iBit == pCex->nBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCex.c"
                  ,0x17b,"Abc_Cex_t *Gia_ManCexExtendToIncludeAllObjects(Gia_Man_t *, Abc_Cex_t *)")
    ;
  }
  uVar14 = pCex->iPo;
  iVar9 = p->vCos->nSize;
  if (iVar9 - p->nRegs <= (int)uVar14) {
    __assert_fail("v < Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x1a7,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
  }
  if ((-1 < (int)uVar14) && ((int)uVar14 < iVar9)) {
    iVar9 = p->vCos->pArray[uVar14];
    if ((-1 < (long)iVar9) && (iVar9 < p->nObjs)) {
      if ((p->pObjs[iVar9].field_0x3 & 0x40) == 0) {
        __assert_fail("Gia_ManPo(p, pCex->iPo)->fMark0 == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCex.c"
                      ,0x17c,
                      "Abc_Cex_t *Gia_ManCexExtendToIncludeAllObjects(Gia_Man_t *, Abc_Cex_t *)");
      }
      Gia_ManCleanMark0(p);
      return pAVar4;
    }
LAB_0065c65f:
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
LAB_0065c67e:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

Abc_Cex_t * Gia_ManCexExtendToIncludeAllObjects( Gia_Man_t * p, Abc_Cex_t * pCex )
{
    Abc_Cex_t * pNew;
    Gia_Obj_t * pObj, * pObjRo, * pObjRi;
    int i, k, iBit = 0;
    assert( pCex->nRegs > 0 );
    // start the counter-example
    pNew = Abc_CexAlloc( 0, Gia_ManObjNum(p), pCex->iFrame + 1 );
    pNew->iFrame = pCex->iFrame;
    pNew->iPo    = pCex->iPo;
    // set const0
    Gia_ManConst0(p)->fMark0 = 0;
    // set init state
    Gia_ManForEachRi( p, pObjRi, k )
        pObjRi->fMark0 = Abc_InfoHasBit(pCex->pData, iBit++);
    assert( iBit == pCex->nRegs );
    for ( i = 0; i <= pCex->iFrame; i++ )
    {
        Gia_ManForEachPi( p, pObj, k )
            pObj->fMark0 = Abc_InfoHasBit(pCex->pData, iBit++);
        Gia_ManForEachRiRo( p, pObjRi, pObjRo, k )
            pObjRo->fMark0 = pObjRi->fMark0;
        Gia_ManForEachObj( p, pObj, k )
            if ( pObj->fMark0 )
                Abc_InfoSetBit( pNew->pData, pNew->nPis * i + k );
        Gia_ManForEachAnd( p, pObj, k )
            pObj->fMark0 = (Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj)) & (Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj));
        Gia_ManForEachCo( p, pObj, k )
            pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
    }
    assert( iBit == pCex->nBits );
    assert( Gia_ManPo(p, pCex->iPo)->fMark0 == 1 );
    Gia_ManCleanMark0(p);
    return pNew;
}